

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cc
# Opt level: O0

bool rcg::isFormatSupported(uint64_t pixelformat,bool only_color)

{
  bool only_color_local;
  uint64_t pixelformat_local;
  undefined1 local_1;
  
  if ((((pixelformat == 0x20c005a) || (pixelformat == 0x210003b)) || (pixelformat == 0x2100032)) ||
     (((pixelformat == 0x2180014 || (pixelformat == 0x1080009)) ||
      ((pixelformat == 0x108000b || ((pixelformat == 0x1080008 || (pixelformat == 0x108000a))))))))
  {
    local_1 = true;
  }
  else if ((only_color) ||
          (((pixelformat != 0x1080001 && (pixelformat != 0x10800c6)) && (pixelformat != 0x81080001))
          )) {
    local_1 = false;
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool isFormatSupported(uint64_t pixelformat, bool only_color)
{
  if (pixelformat == YCbCr411_8 || pixelformat == YCbCr422_8 || pixelformat == YUV422_8 ||
    pixelformat == RGB8 || pixelformat == BayerRG8 || pixelformat == BayerBG8 ||
    pixelformat == BayerGR8 || pixelformat == BayerGB8)
  {
    return true;
  }

  if (!only_color && (pixelformat == Mono8 || pixelformat == Confidence8 ||
    pixelformat == Error8))
  {
    return true;
  }

  return false;
}